

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2mid.cpp
# Opt level: O2

string * instrument_callback_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t bank_msb,uint8_t bank_lsb,
                   uint8_t instrument)

{
  mapped_type *this;
  ostream *poVar1;
  undefined7 in_register_00000031;
  string name;
  string si;
  string smsb;
  string slsb;
  string local_a0;
  key_type local_80;
  key_type local_60;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_40 = local_30;
  local_38 = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_30[0] = 0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_a0,(int)CONCAT71(in_register_00000031,bank_msb));
  std::__cxx11::string::operator=((string *)&local_60,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::to_string(&local_a0,(uint)bank_lsb);
  std::__cxx11::string::operator=((string *)&local_40,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::to_string(&local_a0,(uint)instrument);
  std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
         ::operator[](&js_abi_cxx11_,&local_60);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](this,&local_80);
  std::__cxx11::string::_M_assign((string *)&local_a0);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_60);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::operator<<(poVar1,(string *)&local_80);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)&local_a0);
  std::endl<char,std::char_traits<char>>(poVar1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  if (local_a0._M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string instrument_callback(uint8_t bank_msb, uint8_t bank_lsb, uint8_t instrument)
{

	std::string smsb, slsb, si;

	smsb = std::to_string((int)bank_msb);
	slsb = std::to_string((int)bank_lsb);
	si = std::to_string((int)instrument);

	std::string name;

	try
	{
		name = js[smsb][si];
		std::cout << smsb << ":" << si << " " << name << std::endl;
	}
	catch (...)
	{
		name = "";
	}

	std::string out;

	out += smsb;
	out += ":";
	out += si;
	
	if (name.length())
	{
		out += " ";
		out += name;
	}

	return out;
}